

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

mp_int * monty_invert(MontyContext *mc,mp_int *x)

{
  mp_int *x_00;
  mp_int *pmVar1;
  
  x_00 = mp_invert(x,mc->m);
  pmVar1 = monty_mul(mc,x_00,mc->powers_of_r_mod_m[2]);
  mp_free(x_00);
  return pmVar1;
}

Assistant:

mp_int *monty_invert(MontyContext *mc, mp_int *x)
{
    /* Given xr, we want to return x^{-1}r = (xr)^{-1} r^2 =
     * monty_reduce((xr)^{-1} r^3) */
    mp_int *tmp = mp_invert(x, mc->m);
    mp_int *toret = monty_mul(mc, tmp, mc->powers_of_r_mod_m[2]);
    mp_free(tmp);
    return toret;
}